

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ConfigLiblistSyntax::setChild
          (ConfigLiblistSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 0) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->liblist).kind = TVar4.kind;
    (this->liblist).field_0x2 = TVar4._2_1_;
    (this->liblist).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->liblist).rawLen = TVar4.rawLen;
    (this->liblist).info = TVar4.info;
  }
  else {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->libraries).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->libraries).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->libraries).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->libraries).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    (this->libraries).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar3[1].parent;
    (this->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar1;
  }
  return;
}

Assistant:

void ConfigLiblistSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: liblist = child.token(); return;
        case 1: libraries = child.node()->as<TokenList>(); return;
        default: SLANG_UNREACHABLE;
    }
}